

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

bool __thiscall llvm::DWARFVerifier::handleDebugLine(DWARFVerifier *this)

{
  this->NumDebugLineErrors = 0;
  raw_ostream::operator<<(this->OS,"Verifying .debug_line...\n");
  verifyDebugLineStmtOffsets(this);
  verifyDebugLineRows(this);
  return this->NumDebugLineErrors == 0;
}

Assistant:

bool DWARFVerifier::handleDebugLine() {
  NumDebugLineErrors = 0;
  OS << "Verifying .debug_line...\n";
  verifyDebugLineStmtOffsets();
  verifyDebugLineRows();
  return NumDebugLineErrors == 0;
}